

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize_tests.cpp
# Opt level: O2

void cluster_linearize_tests::(anonymous_namespace)::
     TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
               (Cluster<bitset_detail::IntBitSet<unsigned_int>_> *cluster,string *hexenc)

{
  long lVar1;
  pointer ppVar2;
  uint uVar3;
  bool bVar4;
  iterator pvVar5;
  uint uVar6;
  iterator pvVar7;
  long lVar8;
  uint uVar9;
  iterator in_R8;
  uint uVar10;
  uint uVar11;
  iterator in_R9;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *pDVar12;
  uint uVar13;
  long in_FS_OFFSET;
  const_string file;
  Span<const_unsigned_char> s;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  VectorWriter writer_1;
  shared_count sStack_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  SpanReader reader;
  char *local_f8;
  char *local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> ser;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> depgraph;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoding;
  VectorWriter writer;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> depgraph_read;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::DepGraph(&depgraph,cluster);
  lVar8 = (long)depgraph.entries.
                super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)depgraph.entries.
                super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                ._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (iterator)(lVar8 / 0x18);
  for (uVar6 = 0; (iterator)(ulong)uVar6 < pvVar5; uVar6 = uVar6 + 1) {
    uVar13 = depgraph.entries.
             super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start[(long)(ulong)uVar6].ancestors.m_val;
    if ((uVar13 >> (uVar6 & 0x1f) & 1) == 0) {
      __assert_fail("depgraph.Ancestors(i)[i]",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                    ,0x108,
                    "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                   );
    }
    uVar10 = 0;
    if (uVar13 != 0) {
      for (; (uVar13 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
      }
    }
    if (uVar13 == 0) {
      uVar10 = 0;
    }
    in_R8 = (iterator)(ulong)uVar10;
    uVar10 = ~uVar13;
    in_R9 = (iterator)(ulong)uVar10;
    while (uVar13 != 0) {
      if ((depgraph.entries.
           super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start[(long)in_R8].ancestors.m_val & uVar10) != 0) {
        __assert_fail("depgraph.Ancestors(i).IsSupersetOf(depgraph.Ancestors(a))",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                      ,0x10b,
                      "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                     );
      }
      uVar13 = uVar13 - 1 & uVar13;
      uVar3 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      if (uVar13 != 0) {
        in_R8 = (iterator)(ulong)uVar3;
      }
    }
  }
  for (uVar6 = 0; (iterator)(ulong)uVar6 < pvVar5; uVar6 = uVar6 + 1) {
    uVar13 = 1 << ((byte)uVar6 & 0x1f);
    in_R8 = (iterator)(ulong)uVar13;
    uVar10 = 0;
    while (in_R9 = (iterator)(ulong)uVar10, in_R9 < pvVar5) {
      uVar3 = uVar10 & 0x1f;
      uVar10 = uVar10 + 1;
      if (((depgraph.entries.
            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)(ulong)uVar6].ancestors.m_val >> uVar3 &
           1) != 0) !=
          ((depgraph.entries.
            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)in_R9].descendants.m_val & uVar13) != 0)
         ) {
        __assert_fail("depgraph.Ancestors(i)[j] == depgraph.Descendants(j)[i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                      ,0x111,
                      "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                     );
      }
    }
  }
  uVar6 = 0;
  do {
    pvVar7 = (iterator)(ulong)uVar6;
    if (pvVar5 <= pvVar7) {
      ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      VectorWriter::VectorWriter(&writer_1,&ser,0);
      ::(anonymous_namespace)::DepGraphFormatter::
      Ser<VectorWriter,bitset_detail::IntBitSet<unsigned_int>>(&writer_1,&depgraph);
      writer.nPos = (long)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start;
      writer.vchData =
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&depgraph_read;
      depgraph_read.entries.
      super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      depgraph_read.entries.
      super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      depgraph_read.entries.
      super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      SpanReader::operator>>
                ((SpanReader *)&writer,
                 (Wrapper<(anonymous_namespace)::DepGraphFormatter,_cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>_&>
                  *)&encoding);
      bVar4 = cluster_linearize::operator==(&depgraph,&depgraph_read);
      if (!bVar4) {
        __assert_fail("depgraph == decoded_depgraph",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                      ,0x11c,
                      "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                     );
      }
      if (writer.nPos != 0) {
        __assert_fail("reader.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                      ,0x11d,
                      "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                     );
      }
      if ((ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish ==
           ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start) ||
         (ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish[-1] != '\0')) {
        __assert_fail("ser.size() >= 1 && ser.back() == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                      ,0x120,
                      "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                     );
      }
      ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      writer.nPos = (long)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start;
      writer.vchData =
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ::_M_move_assign(&depgraph_read.entries,
                       (_Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                        *)&encoding);
      std::
      _Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ::~_Vector_base((_Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                       *)&encoding);
      encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&depgraph_read;
      SpanReader::operator>>
                ((SpanReader *)&writer,
                 (Wrapper<(anonymous_namespace)::DepGraphFormatter,_cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>_&>
                  *)&encoding);
      bVar4 = cluster_linearize::operator==(&depgraph,&depgraph_read);
      if (!bVar4) {
        __assert_fail("depgraph == decoded_depgraph",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                      ,0x125,
                      "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                     );
      }
      if (writer.nPos != 0) {
        __assert_fail("reader.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                      ,0x126,
                      "void (anonymous namespace)::SanityCheck(const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                     );
      }
      std::
      _Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
      ::~_Vector_base((_Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                       *)&depgraph_read);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      lVar8 = (long)depgraph.entries.
                    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)depgraph.entries.
                    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      pvVar5 = (iterator)(lVar8 / 0x18);
      break;
    }
    uVar10 = 1 << ((byte)uVar6 & 0x1f);
    in_R9 = (iterator)(ulong)uVar10;
    uVar13 = depgraph.entries.
             super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start[(long)pvVar7].descendants.m_val &
             depgraph.entries.
             super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
             ._M_impl.super__Vector_impl_data._M_start[(long)pvVar7].ancestors.m_val;
    in_R8 = (iterator)(ulong)uVar13;
    uVar6 = uVar6 + 1;
  } while (uVar13 == uVar10);
  ppVar2 = (cluster->
           super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(cluster->
            super__Vector_base<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 != lVar8) {
    __assert_fail("cluster.size() == depgraph.TxCount()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                  ,0x132,
                  "void (anonymous namespace)::VerifyDepGraphFromCluster(const Cluster<SetType> &, const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                 );
  }
  uVar6 = 0;
  do {
    pvVar7 = (iterator)(ulong)uVar6;
    if (pvVar5 <= pvVar7) {
      uVar6 = 0;
      while( true ) {
        pvVar7 = (iterator)(ulong)uVar6;
        if (pvVar5 <= pvVar7) {
          encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          VectorWriter::VectorWriter(&writer,&encoding,0);
          ::(anonymous_namespace)::DepGraphFormatter::
          Ser<VectorWriter,bitset_detail::IntBitSet<unsigned_int>>(&writer,&depgraph);
          local_b0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cluster_linearize_tests.cpp"
          ;
          local_a8 = "";
          local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
          file.m_end = &DAT_00000022;
          file.m_begin = (iterator)&local_b0;
          msg.m_end = in_R9;
          msg.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c0,
                     msg);
          ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((ulong)ser.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
          ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011480b0;
          ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
          local_f8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cluster_linearize_tests.cpp"
          ;
          local_f0 = "";
          s.m_size = (long)encoding.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)encoding.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
          s.m_data = encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          HexStr_abi_cxx11_((string *)&depgraph_read,s);
          pvVar5 = (iterator)0x2;
          pDVar12 = &depgraph_read;
          boost::test_tools::tt_detail::
          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                    (&ser,&local_f8,0x22,1,2,pDVar12,"HexStr(encoding)",hexenc,"hexenc");
          std::__cxx11::string::~string((string *)&depgraph_read);
          reader.m_data.m_size =
               (long)encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          reader.m_data.m_data =
               encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          depgraph_read.entries.
          super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          depgraph_read.entries.
          super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          depgraph_read.entries.
          super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&depgraph_read;
          SpanReader::operator>>
                    (&reader,(Wrapper<(anonymous_namespace)::DepGraphFormatter,_cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>_&>
                              *)&ser);
          local_118 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cluster_linearize_tests.cpp"
          ;
          local_110 = "";
          local_128 = &boost::unit_test::basic_cstring<char_const>::null;
          local_120 = &boost::unit_test::basic_cstring<char_const>::null;
          file_00.m_end = (iterator)0x29;
          file_00.m_begin = (iterator)&local_118;
          msg_00.m_end = (iterator)pDVar12;
          msg_00.m_begin = pvVar5;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
                     (size_t)&local_128,msg_00);
          writer_1.vchData._0_1_ = cluster_linearize::operator==(&depgraph,&depgraph_read);
          writer_1.nPos = 0;
          sStack_130.pi_ = (sp_counted_base *)0x0;
          local_150 = "depgraph == depgraph_read";
          local_148 = "";
          ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((ulong)ser.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
          ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_011481f0;
          ser.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = boost::unit_test::lazy_ostream::inst;
          local_160 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/cluster_linearize_tests.cpp"
          ;
          local_158 = "";
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)&writer_1,(lazy_ostream *)&ser,1,0,WARN,(check_type)hexenc,
                     (size_t)&local_160,0x29);
          boost::detail::shared_count::~shared_count(&sStack_130);
          std::
          _Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
          ::~_Vector_base((_Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                           *)&depgraph_read);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&encoding.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          std::
          _Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
          ::~_Vector_base((_Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                           *)&depgraph);
          if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
            __stack_chk_fail();
          }
          return;
        }
        uVar9 = 1 << ((byte)uVar6 & 0x1f);
        uVar10 = uVar9;
        uVar13 = uVar9;
        uVar3 = uVar9;
        do {
          for (; uVar11 = uVar3, uVar13 != 0; uVar13 = uVar13 - 1 & uVar13) {
            uVar3 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
              }
            }
            uVar10 = uVar10 | ppVar2[uVar3].second.m_val;
            uVar3 = uVar11;
          }
          uVar13 = uVar10;
          uVar3 = uVar10;
        } while (uVar11 != uVar10);
        if (depgraph.entries.
            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
            ._M_impl.super__Vector_impl_data._M_start[(long)pvVar7].ancestors.m_val != uVar11)
        break;
        if ((uVar11 & uVar9) == 0) {
          __assert_fail("ancestors[i]",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                        ,0x147,
                        "void (anonymous namespace)::VerifyDepGraphFromCluster(const Cluster<SetType> &, const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                       );
        }
        in_R8 = (iterator)(ulong)*(uint *)((iterator)((long)pvVar7 * 0x18) + (long)&ppVar2->second);
        in_R9 = (iterator)((long)pvVar7 * 0x18);
        while (uVar13 = (uint)in_R8, uVar13 != 0) {
          if ((-uVar13 & uVar11 & uVar13) == 0) {
            __assert_fail("ancestors[parent]",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                          ,0x14a,
                          "void (anonymous namespace)::VerifyDepGraphFromCluster(const Cluster<SetType> &, const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                         );
          }
          in_R8 = (iterator)(ulong)(uVar13 - 1 & uVar13);
          in_R9 = in_R8;
        }
        uVar6 = uVar6 + 1;
      }
      __assert_fail("depgraph.Ancestors(i) == ancestors",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                    ,0x144,
                    "void (anonymous namespace)::VerifyDepGraphFromCluster(const Cluster<SetType> &, const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
                   );
    }
    if (depgraph.entries.
        super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
        ._M_impl.super__Vector_impl_data._M_start[(long)pvVar7].feerate.fee !=
        ppVar2[(long)pvVar7].first.fee) break;
    uVar6 = uVar6 + 1;
    uVar13 = ppVar2[(long)pvVar7].first.size;
    in_R8 = (iterator)(ulong)uVar13;
  } while (depgraph.entries.
           super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
           ._M_impl.super__Vector_impl_data._M_start[(long)pvVar7].feerate.size == uVar13);
  __assert_fail("depgraph.FeeRate(i) == cluster[i].first",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/cluster_linearize.h"
                ,0x135,
                "void (anonymous namespace)::VerifyDepGraphFromCluster(const Cluster<SetType> &, const DepGraph<SetType> &) [SetType = bitset_detail::IntBitSet<unsigned int>]"
               );
}

Assistant:

void TestDepGraphSerialization(const Cluster<SetType>& cluster, const std::string& hexenc)
{
    DepGraph depgraph(cluster);

    // Run normal sanity and correspondence checks, which includes a round-trip test.
    VerifyDepGraphFromCluster(cluster, depgraph);

    // There may be multiple serializations of the same graph, but DepGraphFormatter's serializer
    // only produces one of those. Verify that hexenc matches that canonical serialization.
    std::vector<unsigned char> encoding;
    VectorWriter writer(encoding, 0);
    writer << Using<DepGraphFormatter>(depgraph);
    BOOST_CHECK_EQUAL(HexStr(encoding), hexenc);

    // Test that deserializing that encoding yields depgraph. This is effectively already implied
    // by the round-trip test above (if depgraph is acyclic), but verify it explicitly again here.
    SpanReader reader(encoding);
    DepGraph<SetType> depgraph_read;
    reader >> Using<DepGraphFormatter>(depgraph_read);
    BOOST_CHECK(depgraph == depgraph_read);
}